

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTPSocket.cpp
# Opt level: O0

HTTPParser * __thiscall uWS::HTTPParser::operator++(HTTPParser *this,int param_2)

{
  char *pcVar1;
  int iVar2;
  pair<char_*,_unsigned_long> *__p;
  HTTPParser *in_RDI;
  bool bVar3;
  size_t length;
  int local_74;
  char *local_70;
  pair<char_*,_unsigned_long> local_68;
  pair<char_*,_unsigned_long> local_58;
  pair<char_*,_unsigned_long> local_48;
  int local_34;
  char *local_30;
  pair<char_*,_unsigned_long> local_28;
  unsigned_long local_18 [3];
  
  local_18[0] = 0;
  while( true ) {
    bVar3 = false;
    if (*in_RDI->cursor == '\r') {
      bVar3 = in_RDI->cursor[1] == '\n';
    }
    if (bVar3) break;
    in_RDI->cursor = in_RDI->cursor + 1;
  }
  in_RDI->cursor = in_RDI->cursor + 2;
  if ((*in_RDI->cursor == '\r') && (in_RDI->cursor[1] == '\n')) {
    local_30 = (char *)0x0;
    local_34 = 0;
    std::pair<char_*,_unsigned_long>::pair<int,_true>(&local_28,&local_30,&local_34);
    __p = std::pair<char_*,_unsigned_long>::operator=(&in_RDI->value,&local_28);
    std::pair<char_*,_unsigned_long>::operator=(&in_RDI->key,__p);
  }
  else {
    while( true ) {
      bVar3 = false;
      if (in_RDI->cursor[local_18[0]] != ':') {
        bVar3 = in_RDI->cursor[local_18[0]] != '\r';
      }
      if (!bVar3) break;
      local_18[0] = local_18[0] + 1;
    }
    std::pair<char_*,_unsigned_long>::pair<char_*&,_unsigned_long_&,_true>
              (&local_48,&in_RDI->cursor,local_18);
    std::pair<char_*,_unsigned_long>::operator=(&in_RDI->key,&local_48);
    if (in_RDI->cursor[local_18[0]] == '\r') {
      local_70 = (char *)0x0;
      local_74 = 0;
      std::pair<char_*,_unsigned_long>::pair<int,_true>(&local_68,&local_70,&local_74);
      std::pair<char_*,_unsigned_long>::operator=(&in_RDI->value,&local_68);
    }
    else {
      in_RDI->cursor = in_RDI->cursor + local_18[0];
      local_18[0] = 0;
      do {
        pcVar1 = in_RDI->cursor;
        in_RDI->cursor = pcVar1 + 1;
        iVar2 = isspace((int)pcVar1[1]);
      } while (iVar2 != 0);
      for (; in_RDI->cursor[local_18[0]] != '\r'; local_18[0] = local_18[0] + 1) {
      }
      std::pair<char_*,_unsigned_long>::pair<char_*&,_unsigned_long_&,_true>
                (&local_58,&in_RDI->cursor,local_18);
      std::pair<char_*,_unsigned_long>::operator=(&in_RDI->value,&local_58);
    }
  }
  return in_RDI;
}

Assistant:

HTTPParser &operator++(int)
    {
        size_t length = 0;
        for (; !(cursor[0] == '\r' && cursor[1] == '\n'); cursor++);
        cursor += 2;
        if (cursor[0] == '\r' && cursor[1] == '\n') {
            key = value = {0, 0};
        } else {
            for (; cursor[length] != ':' && cursor[length] != '\r'; length++);
            key = {cursor, length};
            if (cursor[length] != '\r') {
                cursor += length;
                length = 0;
                while (isspace(*(++cursor)));
                for (; cursor[length] != '\r'; length++);
                value = {cursor, length};
            } else {
                value = {0, 0};
            }
        }
        return *this;
    }